

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void do_atomic_op_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i32 addr,TCGv_i64 val,
                     TCGArg idx,MemOp memop,void **table)

{
  MemOp opc;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  uintptr_t o;
  uintptr_t o_1;
  
  opc = tcg_canonicalize_memop(memop,true,false);
  if ((~opc & 3) == 0) {
    gen_helper_exit_atomic(tcg_ctx,tcg_ctx->cpu_env);
    tcg_gen_movi_i64_tricore(tcg_ctx,ret,0);
    return;
  }
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  ret_01 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_extrl_i64_i32_tricore(tcg_ctx,ret_00,val);
  do_atomic_op_i32(tcg_ctx,ret_01,addr,ret_00,idx,opc & ~MO_ASHIFT,table);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_gen_extu_i32_i64_tricore(tcg_ctx,ret,ret_01);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  if ((opc & MO_ASHIFT) == MO_8) {
    return;
  }
  tcg_gen_ext_i64(tcg_ctx,ret,ret,opc);
  return;
}

Assistant:

static void do_atomic_op_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv addr, TCGv_i64 val,
                             TCGArg idx, MemOp memop, void * const table[])
{
    memop = tcg_canonicalize_memop(memop, 1, 0);

    if ((memop & MO_SIZE) == MO_64) {
#ifdef CONFIG_ATOMIC64
        gen_atomic_op_i64 gen;

        gen = table[memop & (MO_SIZE | MO_BSWAP)];
        tcg_debug_assert(gen != NULL);

        {
            TCGv_i32 oi = tcg_const_i32(tcg_ctx, make_memop_idx(memop & ~MO_SIGN, idx));
            gen(tcg_ctx, ret, tcg_ctx->cpu_env, addr, val, oi);
            tcg_temp_free_i32(tcg_ctx, oi);
        }
#else
        gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
        /* Produce a result, so that we have a well-formed opcode stream
           with respect to uses of the result in the (dead) code following.  */
        tcg_gen_movi_i64(tcg_ctx, ret, 0);
#endif /* CONFIG_ATOMIC64 */
    } else {
        TCGv_i32 v32 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 r32 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_extrl_i64_i32(tcg_ctx, v32, val);
        do_atomic_op_i32(tcg_ctx, r32, addr, v32, idx, memop & ~MO_SIGN, table);
        tcg_temp_free_i32(tcg_ctx, v32);

        tcg_gen_extu_i32_i64(tcg_ctx, ret, r32);
        tcg_temp_free_i32(tcg_ctx, r32);

        if (memop & MO_SIGN) {
            tcg_gen_ext_i64(tcg_ctx, ret, ret, memop);
        }
    }
}